

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolOcclusionTests.cpp
# Opt level: O0

void __thiscall
vkt::QueryPool::anon_unknown_0::
QueryPoolOcclusionTest<vkt::QueryPool::(anonymous_namespace)::OcclusionQueryTestInstance>::
initPrograms(QueryPoolOcclusionTest<vkt::QueryPool::(anonymous_namespace)::OcclusionQueryTestInstance>
             *this,SourceCollections *programCollection)

{
  SourceCollections *this_00;
  ProgramSources *pPVar1;
  allocator<char> local_111;
  string local_110;
  ShaderSource local_f0;
  allocator<char> local_c1;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  ShaderSource local_78;
  allocator<char> local_39;
  string local_38;
  SourceCollections *local_18;
  SourceCollections *programCollection_local;
  QueryPoolOcclusionTest<vkt::QueryPool::(anonymous_namespace)::OcclusionQueryTestInstance>
  *this_local;
  
  local_18 = programCollection;
  programCollection_local = (SourceCollections *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"frag",&local_39);
  pPVar1 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,
             "#version 400\nlayout(location = 0) out vec4 out_FragColor;\nvoid main()\n{\n\tout_FragColor = vec4(0.07, 0.48, 0.75, 1.0);\n}\n"
             ,&local_99);
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_78,&local_98);
  glu::ProgramSources::operator<<(pPVar1,&local_78);
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  this_00 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"vert",&local_c1);
  pPVar1 = ::vk::ProgramCollection<glu::ProgramSources>::add(&this_00->glslSources,&local_c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,
             "#version 430\nlayout(location = 0) in vec4 in_Position;\nout gl_PerVertex { vec4 gl_Position; float gl_PointSize; };\nvoid main() {\n\tgl_Position  = in_Position;\n\tgl_PointSize = 1.0;\n}\n"
             ,&local_111);
  glu::VertexSource::VertexSource((VertexSource *)&local_f0,&local_110);
  glu::ProgramSources::operator<<(pPVar1,&local_f0);
  glu::VertexSource::~VertexSource((VertexSource *)&local_f0);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator(&local_111);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  return;
}

Assistant:

void initPrograms(vk::SourceCollections& programCollection) const
	{
		programCollection.glslSources.add("frag") << glu::FragmentSource("#version 400\n"
																	   "layout(location = 0) out vec4 out_FragColor;\n"
																	   "void main()\n"
																	   "{\n"
																	   "	out_FragColor = vec4(0.07, 0.48, 0.75, 1.0);\n"
																	   "}\n");

		programCollection.glslSources.add("vert") << glu::VertexSource("#version 430\n"
																		 "layout(location = 0) in vec4 in_Position;\n"
																		 "out gl_PerVertex { vec4 gl_Position; float gl_PointSize; };\n"
																		 "void main() {\n"
																		 "	gl_Position  = in_Position;\n"
																		 "	gl_PointSize = 1.0;\n"
																		 "}\n");
	}